

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool IsValidEdgeFaceLink(ON_SubDEdge *edge,ON_SubDFace *face,uint edge_face_index,
                        uint face_edge_index,bool bSilentError)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  ON_SubDEdgePtr *pOVar5;
  ON_SubDFacePtr *pOVar6;
  ON_SubDFacePtr *pOVar7;
  ON_SubDEdgePtr *pOVar8;
  ulong uVar9;
  
  if ((((((edge == (ON_SubDEdge *)0x0 || face == (ON_SubDFace *)0x0) ||
         ((edge->super_ON_SubDComponentBase).m_level != (face->super_ON_SubDComponentBase).m_level))
        || (uVar1 = edge->m_face_count, uVar1 == 0)) ||
       ((2 < uVar1 && (edge->m_facex == (ON_SubDFacePtr *)0x0)))) ||
      ((edge_face_index != 0xffffffff && uVar1 <= edge_face_index ||
       (uVar2 = face->m_edge_count, uVar2 == 0)))) ||
     (((4 < uVar2 && (face->m_edgex == (ON_SubDEdgePtr *)0x0)) ||
      (uVar4 = (uint)uVar2, face_edge_index != 0xffffffff && uVar4 <= face_edge_index)))) {
LAB_005d67a2:
    bVar3 = ON_SubDIsNotValid(bSilentError);
    return bVar3;
  }
  pOVar7 = edge->m_face2;
  for (uVar9 = 0; (uint)uVar1 != uVar9; uVar9 = uVar9 + 1) {
    pOVar6 = pOVar7;
    if (1 < uVar9) {
      pOVar6 = edge->m_facex + (uVar9 - 2);
    }
    if ((ON_SubDFace *)(pOVar6->m_ptr & 0xfffffffffffffff8) == face) {
      if (edge_face_index == 0xffffffff) {
        edge_face_index = (uint)uVar9;
      }
      else if (uVar9 != edge_face_index) goto LAB_005d67a2;
    }
    else if (uVar9 == edge_face_index) goto LAB_005d67a2;
    pOVar7 = pOVar7 + 1;
  }
  pOVar5 = face->m_edge4;
  uVar9 = 0;
  do {
    if (uVar4 == uVar9) {
      return true;
    }
    pOVar8 = pOVar5;
    if (3 < uVar9) {
      pOVar8 = face->m_edgex + (uVar9 - 4);
    }
    if ((ON_SubDEdge *)(pOVar8->m_ptr & 0xfffffffffffffff8) == edge) {
      if (face_edge_index == 0xffffffff) {
        face_edge_index = (uint)uVar9;
      }
      else if (uVar9 != face_edge_index) goto LAB_005d685e;
    }
    else if (uVar9 == face_edge_index) {
LAB_005d685e:
      bVar3 = ON_SubDIsNotValid(bSilentError);
      return bVar3 || uVar4 <= uVar9;
    }
    uVar9 = uVar9 + 1;
    pOVar5 = pOVar5 + 1;
  } while( true );
}

Assistant:

static bool IsValidEdgeFaceLink(
  const ON_SubDEdge* edge,
  const ON_SubDFace* face,
  unsigned int edge_face_index,
  unsigned int face_edge_index,
  bool bSilentError
  )
{
  if (nullptr == edge || nullptr == face)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->SubdivisionLevel() != face->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int edge_face_count = edge->m_face_count;
  if (edge_face_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (edge_face_count > 2 && nullptr == edge->m_facex)
    return ON_SubDIsNotValid(bSilentError);

  if (edge_face_index >= edge_face_count && ON_UNSET_UINT_INDEX != edge_face_index)
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int face_edge_count = face->m_edge_count;
  if (face_edge_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (face_edge_count > 4 && nullptr == face->m_edgex)
    return ON_SubDIsNotValid(bSilentError);

  if (face_edge_index >= face_edge_count && ON_UNSET_UINT_INDEX != face_edge_index)
    return ON_SubDIsNotValid(bSilentError);

  for (unsigned int i = 0; i < edge_face_count; i++)
  {
    if (face == edge->Face(i))
    {
      if (ON_UNSET_UINT_INDEX == edge_face_index)
        edge_face_index = i;
      else if (i != edge_face_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == edge_face_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  for (unsigned int i = 0; i < face_edge_count; i++)
  {
    if (edge == face->Edge(i))
    {
      if (ON_UNSET_UINT_INDEX == face_edge_index)
        face_edge_index = i;
      else if (i != face_edge_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == face_edge_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  return true;
}